

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_part.cpp
# Opt level: O3

void duckdb::DatePartCachedFunction<duckdb::DatePart::DayOperator,duckdb::timestamp_t>
               (DataChunk *args,ExpressionState *state,Vector *result)

{
  ValidityMask *pVVar1;
  element_type *count;
  int64_t *piVar2;
  int64_t *piVar3;
  unsigned_long *puVar4;
  data_ptr_t pdVar5;
  ulong uVar6;
  __uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_> _Var7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var8;
  byte bVar9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var10;
  SelectionVector *pSVar11;
  SelectionVector *pSVar12;
  data_ptr_t pdVar13;
  date_t dVar14;
  reference vector;
  undefined1 *puVar15;
  element_type *peVar16;
  TemplatedValidityData<unsigned_long> *pTVar17;
  _Head_base<0UL,_unsigned_long_*,_false> _Var18;
  int64_t iVar19;
  ulong uVar20;
  data_ptr_t pdVar21;
  idx_t idx_in_entry;
  element_type *peVar22;
  element_type *peVar23;
  element_type *local_b8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_b0;
  data_ptr_t local_a8;
  ValidityMask *local_a0;
  ulong local_98;
  data_ptr_t local_90;
  data_ptr_t local_88;
  idx_t local_80;
  UnifiedVectorFormat local_78;
  
  local_78.sel = (SelectionVector *)state[1]._vptr_ExpressionState;
  optional_ptr<duckdb::FunctionLocalState,_true>::CheckValid
            ((optional_ptr<duckdb::FunctionLocalState,_true> *)&local_78);
  pSVar11 = local_78.sel;
  vector = vector<duckdb::Vector,_true>::operator[](&args->data,0);
  count = (element_type *)args->count;
  if (vector->vector_type == FLAT_VECTOR) {
    Vector::SetVectorType(result,FLAT_VECTOR);
    pdVar21 = result->data;
    pdVar5 = vector->data;
    FlatVector::VerifyFlatVector(vector);
    FlatVector::VerifyFlatVector(result);
    pVVar1 = &result->validity;
    if ((vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) {
      if (count != (element_type *)0x0) {
        peVar22 = (element_type *)0x0;
        do {
          dVar14 = Timestamp::GetDate((timestamp_t)*(int64_t *)(pdVar5 + (long)peVar22 * 8));
          iVar19 = DateLookupCache<duckdb::DatePart::DayOperator>::ExtractElement
                             ((DateLookupCache<duckdb::DatePart::DayOperator> *)
                              &pSVar11->selection_data,dVar14,pVVar1,(idx_t)peVar22);
          *(int64_t *)(pdVar21 + (long)peVar22 * 8) = iVar19;
          peVar22 = (element_type *)
                    ((long)&(peVar22->owned_data).
                            super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>
                            ._M_t + 1);
        } while (count != peVar22);
      }
    }
    else {
      (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity = (idx_t)count;
      local_b8 = count;
      make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long*const&,unsigned_long&>
                ((duckdb *)&local_78,(unsigned_long **)&vector->validity,(unsigned_long *)&local_b8)
      ;
      pdVar13 = local_78.data;
      pSVar12 = local_78.sel;
      local_78.sel = (SelectionVector *)0x0;
      local_78.data = (data_ptr_t)0x0;
      p_Var8 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi;
      (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)pSVar12;
      (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pdVar13;
      if ((p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
         (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var8),
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78.data !=
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78.data);
      }
      pTVar17 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                          (&(result->validity).super_TemplatedValidityMask<unsigned_long>.
                            validity_data);
      (pVVar1->super_TemplatedValidityMask<unsigned_long>).validity_mask =
           (unsigned_long *)
           (pTVar17->owned_data).
           super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
           super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
           super__Head_base<0UL,_unsigned_long_*,_false>;
      puVar15 = (undefined1 *)
                ((long)&count[7].owned_data.
                        super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
                        _M_t + 7);
      if ((undefined1 *)0x3f < puVar15) {
        local_98 = 0;
        peVar22 = (element_type *)0x0;
        local_a8 = pdVar21;
        local_a0 = &vector->validity;
        do {
          puVar4 = (local_a0->super_TemplatedValidityMask<unsigned_long>).validity_mask;
          if (puVar4 == (unsigned_long *)0x0) {
            peVar16 = peVar22 + 8;
            if (count <= peVar22 + 8) {
              peVar16 = count;
            }
LAB_01adebf5:
            peVar23 = peVar22;
            if (peVar22 < peVar16) {
              do {
                dVar14 = Timestamp::GetDate((timestamp_t)*(int64_t *)(pdVar5 + (long)peVar22 * 8));
                iVar19 = DateLookupCache<duckdb::DatePart::DayOperator>::ExtractElement
                                   ((DateLookupCache<duckdb::DatePart::DayOperator> *)
                                    &pSVar11->selection_data,dVar14,pVVar1,(idx_t)peVar22);
                *(int64_t *)(pdVar21 + (long)peVar22 * 8) = iVar19;
                peVar22 = (element_type *)
                          ((long)&(peVar22->owned_data).
                                  super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>
                                  ._M_t + 1);
                peVar23 = peVar16;
              } while (peVar16 != peVar22);
            }
          }
          else {
            uVar6 = puVar4[local_98];
            peVar16 = peVar22 + 8;
            if (count <= peVar22 + 8) {
              peVar16 = count;
            }
            peVar23 = peVar16;
            if (uVar6 != 0) {
              if (uVar6 == 0xffffffffffffffff) goto LAB_01adebf5;
              peVar23 = peVar22;
              if (peVar22 < peVar16) {
                local_88 = pdVar21 + (long)peVar22 * 8;
                local_90 = pdVar5 + (long)peVar22 * 8;
                uVar20 = 0;
                do {
                  if ((uVar6 >> (uVar20 & 0x3f) & 1) != 0) {
                    dVar14 = Timestamp::GetDate((timestamp_t)*(int64_t *)(local_90 + uVar20 * 8));
                    iVar19 = DateLookupCache<duckdb::DatePart::DayOperator>::ExtractElement
                                       ((DateLookupCache<duckdb::DatePart::DayOperator> *)
                                        &pSVar11->selection_data,dVar14,pVVar1,
                                        (long)&(peVar22->owned_data).
                                               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>
                                               ._M_t + uVar20);
                    *(int64_t *)(local_88 + uVar20 * 8) = iVar19;
                  }
                  uVar20 = uVar20 + 1;
                  pdVar21 = local_a8;
                  peVar23 = peVar16;
                } while ((long)peVar16 - (long)peVar22 != uVar20);
              }
            }
          }
          local_98 = local_98 + 1;
          peVar22 = peVar23;
        } while (local_98 != (ulong)puVar15 >> 6);
      }
    }
  }
  else if (vector->vector_type == CONSTANT_VECTOR) {
    Vector::SetVectorType(result,CONSTANT_VECTOR);
    piVar2 = (int64_t *)result->data;
    piVar3 = (int64_t *)vector->data;
    puVar4 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if ((puVar4 == (unsigned_long *)0x0) || ((*puVar4 & 1) != 0)) {
      ConstantVector::SetNull(result,false);
      dVar14 = Timestamp::GetDate((timestamp_t)*piVar3);
      iVar19 = DateLookupCache<duckdb::DatePart::DayOperator>::ExtractElement
                         ((DateLookupCache<duckdb::DatePart::DayOperator> *)&pSVar11->selection_data
                          ,dVar14,&result->validity,0);
      *piVar2 = iVar19;
    }
    else {
      ConstantVector::SetNull(result,true);
    }
  }
  else {
    UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
    Vector::ToUnifiedFormat(vector,(idx_t)count,&local_78);
    Vector::SetVectorType(result,FLAT_VECTOR);
    pSVar12 = local_78.sel;
    pdVar21 = result->data;
    FlatVector::VerifyFlatVector(result);
    pVVar1 = &result->validity;
    if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) {
      if (count != (element_type *)0x0) {
        _Var7._M_t.super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
        super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             (((unsafe_unique_array<unsigned_long> *)&pSVar12->sel_vector)->
             super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>)._M_t.
             super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t;
        peVar22 = (element_type *)0x0;
        do {
          peVar16 = peVar22;
          if ((_Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>)
              _Var7._M_t.
              super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
              super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl != (unsigned_long *)0x0) {
            peVar16 = (element_type *)
                      (ulong)*(uint *)((long)_Var7._M_t.
                                             super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                                             .super__Head_base<0UL,_unsigned_long_*,_false>.
                                             _M_head_impl + (long)peVar22 * 4);
          }
          dVar14 = Timestamp::GetDate((timestamp_t)((_func_int ***)local_78.data)[(long)peVar16]);
          iVar19 = DateLookupCache<duckdb::DatePart::DayOperator>::ExtractElement
                             ((DateLookupCache<duckdb::DatePart::DayOperator> *)
                              &pSVar11->selection_data,dVar14,pVVar1,(idx_t)peVar22);
          *(int64_t *)(pdVar21 + (long)peVar22 * 8) = iVar19;
          peVar22 = (element_type *)
                    ((long)&(peVar22->owned_data).
                            super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>
                            ._M_t + 1);
        } while (count != peVar22);
      }
    }
    else if (count != (element_type *)0x0) {
      _Var7._M_t.super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
      super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
           (((unsafe_unique_array<unsigned_long> *)&pSVar12->sel_vector)->
           super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>)._M_t.
           super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t;
      peVar22 = (element_type *)0x0;
      do {
        peVar16 = peVar22;
        if ((_Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>)
            _Var7._M_t.
            super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
            super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl != (unsigned_long *)0x0) {
          peVar16 = (element_type *)
                    (ulong)*(uint *)((long)_Var7._M_t.
                                           super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                                           .super__Head_base<0UL,_unsigned_long_*,_false>.
                                           _M_head_impl + (long)peVar22 * 4);
        }
        if ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
             [(ulong)peVar16 >> 6] >> ((ulong)peVar16 & 0x3f) & 1) == 0) {
          _Var18._M_head_impl = (pVVar1->super_TemplatedValidityMask<unsigned_long>).validity_mask;
          if (_Var18._M_head_impl == (unsigned_long *)0x0) {
            local_80 = (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
            make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                      ((duckdb *)&local_b8,&local_80);
            p_Var10 = p_Stack_b0;
            peVar16 = local_b8;
            local_b8 = (element_type *)0x0;
            p_Stack_b0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            p_Var8 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                     internal.
                     super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi;
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = peVar16;
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi = p_Var10;
            if ((p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
               (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var8),
               p_Stack_b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_b0);
            }
            pTVar17 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                (&(result->validity).super_TemplatedValidityMask<unsigned_long>.
                                  validity_data);
            _Var18._M_head_impl =
                 (pTVar17->owned_data).
                 super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                 super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                 super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
            (pVVar1->super_TemplatedValidityMask<unsigned_long>).validity_mask = _Var18._M_head_impl
            ;
          }
          bVar9 = (byte)peVar22 & 0x3f;
          _Var18._M_head_impl[(ulong)peVar22 >> 6] =
               _Var18._M_head_impl[(ulong)peVar22 >> 6] &
               (-2L << bVar9 | 0xfffffffffffffffeU >> 0x40 - bVar9);
        }
        else {
          dVar14 = Timestamp::GetDate((timestamp_t)((_func_int ***)local_78.data)[(long)peVar16]);
          iVar19 = DateLookupCache<duckdb::DatePart::DayOperator>::ExtractElement
                             ((DateLookupCache<duckdb::DatePart::DayOperator> *)
                              &pSVar11->selection_data,dVar14,pVVar1,(idx_t)peVar22);
          *(int64_t *)(pdVar21 + (long)peVar22 * 8) = iVar19;
        }
        peVar22 = (element_type *)
                  ((long)&(peVar22->owned_data).
                          super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
                          _M_t + 1);
      } while (count != peVar22);
    }
    if (local_78.owned_sel.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.owned_sel.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                 .
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
  }
  return;
}

Assistant:

static void DatePartCachedFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	auto &lstate = ExecuteFunctionState::GetFunctionState(state)->Cast<DateCacheLocalState<OP>>();
	UnaryExecutor::ExecuteWithNulls<T, int64_t>(
	    args.data[0], result, args.size(),
	    [&](T input, ValidityMask &mask, idx_t idx) { return lstate.cache.ExtractElement(input, mask, idx); });
}